

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O2

uint __thiscall pktalloc::CustomBitSet<64U>::FindFirstClear(CustomBitSet<64U> *this,uint bitStart)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  
  uVar3 = ~this[bitStart >> 6].Words[0] >> ((ulong)bitStart & 0x3f);
  if (uVar3 != 0) {
    iVar2 = 0;
    for (uVar1 = uVar3; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
      iVar2 = iVar2 + 1;
    }
    if ((uVar3 & 1) != 0) {
      iVar2 = 0;
    }
    return iVar2 + bitStart;
  }
  return 0x40;
}

Assistant:

unsigned FindFirstClear(const unsigned bitStart)
    {
        static_assert(kWordBits == 64, "Update this");

        const unsigned wordStart = bitStart / kWordBits;

        WordT word = ~Words[wordStart] >> (bitStart % kWordBits);
        if (word != 0)
        {
            unsigned offset = 0;
            if ((word & 1) == 0) {
                offset = TrailingZeros64(word);
            }
            return bitStart + offset;
        }

        for (unsigned i = wordStart + 1; i < kWords; ++i)
        {
            word = ~Words[i];
            if (word != 0) {
                return i * kWordBits + TrailingZeros64(word);
            }
        }

        return kValidBits;
    }